

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_user_exception(sexp ctx,sexp self,char *ms,sexp ir)

{
  sexp self_00;
  sexp ctx_00;
  sexp psVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  sexp in_RDI;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp irr;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp str;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp sym;
  sexp res;
  sexp in_stack_ffffffffffffff68;
  sexp in_stack_ffffffffffffff70;
  sexp irritants;
  sexp in_stack_ffffffffffffff88;
  sexp local_60;
  undefined1 local_58 [24];
  sexp_gc_var_t local_40;
  undefined8 local_30;
  undefined8 in_stack_ffffffffffffffd8;
  
  local_30 = &DAT_0000043e;
  memset(&local_40,0,0x10);
  local_58._16_8_ = 0x43e;
  memset(local_58,0,0x10);
  local_60 = (sexp)&DAT_0000043e;
  memset(&stack0xffffffffffffff90,0,0x10);
  local_40.var = (sexp_conflict *)&stack0xffffffffffffffd0;
  local_40.next = (in_RDI->value).context.saves;
  (in_RDI->value).context.saves = &local_40;
  local_58._0_8_ = local_58 + 0x10;
  local_58._8_8_ = (in_RDI->value).context.saves;
  (in_RDI->value).context.saves = (sexp_gc_var_t *)local_58;
  psVar1 = (sexp)&local_60;
  (in_RDI->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffff90;
  irritants = in_RDI;
  self_00 = sexp_intern((sexp)in_RDX,(char *)in_RCX,in_stack_ffffffffffffffd8);
  local_30 = self_00;
  ctx_00 = sexp_c_string(in_stack_ffffffffffffff88,(char *)self_00,(sexp_sint_t)irritants);
  local_58._16_8_ = ctx_00;
  if ((((in_RCX & 3) != 0) || (((sexp)in_RCX)->tag != 6)) && ((sexp)in_RCX != (sexp)&DAT_0000023e))
  {
    in_RCX = sexp_cons_op(ctx_00,self_00,(sexp_sint_t)irritants,in_stack_ffffffffffffff70,
                          in_stack_ffffffffffffff68);
    local_60 = (sexp)in_RCX;
  }
  psVar1 = sexp_make_exception(psVar1,ctx_00,self_00,irritants,(sexp)in_RCX,
                               in_stack_ffffffffffffff68);
  (in_RDI->value).context.saves = local_40.next;
  return psVar1;
}

Assistant:

sexp sexp_user_exception (sexp ctx, sexp self, const char *ms, sexp ir) {
  sexp res;
  sexp_gc_var3(sym, str, irr);
  sexp_gc_preserve3(ctx, sym, str, irr);
  res = sexp_make_exception(ctx, sym = sexp_intern(ctx, "user", -1),
                            str = sexp_c_string(ctx, ms, -1),
                            ((sexp_pairp(ir) || sexp_nullp(ir))
                             ? ir : (irr = sexp_list1(ctx, ir))),
                            self, SEXP_FALSE);
  sexp_gc_release3(ctx);
  return res;
}